

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O2

UniValue *
MempoolToJSON(UniValue *__return_storage_ptr__,CTxMemPool *pool,bool verbose,
             bool include_mempool_sequence)

{
  CTxMemPoolEntry *e;
  string str;
  string str_00;
  string key;
  string str_01;
  string str_02;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  undefined8 uVar1;
  UniValue *__return_storage_ptr___00;
  undefined7 in_register_00000011;
  _Alloc_hider _Var2;
  mutex_type *pmVar3;
  long in_FS_OFFSET;
  undefined8 local_328;
  uint64_t mempool_sequence;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  undefined1 auStack_308 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  UniValue local_2f0;
  string local_298 [32];
  UniValue local_278;
  string local_220 [32];
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [16];
  string local_1e0;
  UniValue local_1c0;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  UniValue local_148;
  string local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  UniValue info;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,verbose) == 0) {
    local_168 = local_158;
    local_160 = 0;
    local_158[0] = 0;
    str_01._M_string_length = (size_type)pool;
    str_01._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    str_01.field_2._M_allocated_capacity = local_328;
    str_01.field_2._8_8_ = mempool_sequence;
    UniValue::UniValue(&info,VARR,str_01);
    std::__cxx11::string::~string((string *)&local_168);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock9,&pool->cs,"pool.cs",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp"
               ,0x168,false);
    CTxMemPool::entryAll
              ((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                *)&criticalblock8,pool);
    uVar1 = criticalblock8.super_unique_lock._8_8_;
    for (pmVar3 = criticalblock8.super_unique_lock._M_device; pmVar3 != (mutex_type *)uVar1;
        pmVar3 = (mutex_type *)((long)&(pmVar3->super___recursive_mutex_base)._M_mutex + 8)) {
      base_blob<256u>::ToString_abi_cxx11_
                (&local_1e0,
                 (base_blob<256u> *)
                 (**(long **)&(pmVar3->super___recursive_mutex_base)._M_mutex + 0x39));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_1c0,&local_1e0);
      val.val._M_dataplus._M_p = (pointer)pool;
      val._0_8_ = __return_storage_ptr__;
      val.val._M_string_length = local_328;
      val.val.field_2._M_allocated_capacity = mempool_sequence;
      val.val.field_2._8_8_ = criticalblock8.super_unique_lock._M_device;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)criticalblock8.super_unique_lock._8_8_;
      val._48_40_ = _auStack_308;
      UniValue::push_back(&info,val);
      UniValue::~UniValue(&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    std::
    _Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                     *)&criticalblock8);
    mempool_sequence = pool->m_sequence_number;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
    if (include_mempool_sequence) {
      local_200 = local_1f0;
      local_1f8 = 0;
      local_1f0[0] = 0;
      str_02._M_string_length = (size_type)pool;
      str_02._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      str_02.field_2._M_allocated_capacity = local_328;
      str_02.field_2._8_8_ = mempool_sequence;
      UniValue::UniValue(__return_storage_ptr__,VOBJ,str_02);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"txids",(allocator<char> *)&local_1e0);
      UniValue::UniValue(&local_278,&info);
      key_00._M_string_length = (size_type)pool;
      key_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      key_00.field_2._M_allocated_capacity = local_328;
      key_00.field_2._8_8_ = mempool_sequence;
      val_01.val._M_dataplus._M_p = (pointer)criticalblock8.super_unique_lock._8_8_;
      val_01._0_8_ = criticalblock8.super_unique_lock._M_device;
      val_01._16_40_ = _auStack_308;
      val_01._56_32_ = local_2f0._16_32_;
      UniValue::pushKV(__return_storage_ptr__,key_00,val_01);
      UniValue::~UniValue(&local_278);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::string<std::allocator<char>>
                (local_298,"mempool_sequence",(allocator<char> *)&local_1e0);
      UniValue::UniValue<unsigned_long_&,_unsigned_long,_true>(&local_2f0,&mempool_sequence);
      key_01._M_string_length = (size_type)pool;
      key_01._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      key_01.field_2._M_allocated_capacity = local_328;
      key_01.field_2._8_8_ = mempool_sequence;
      val_02.val._M_dataplus._M_p = (pointer)criticalblock8.super_unique_lock._8_8_;
      val_02._0_8_ = criticalblock8.super_unique_lock._M_device;
      val_02._16_40_ = _auStack_308;
      val_02._56_32_ = local_2f0._16_32_;
      UniValue::pushKV(__return_storage_ptr__,key_01,val_02);
      UniValue::~UniValue(&local_2f0);
      std::__cxx11::string::~string(local_298);
    }
    else {
      UniValue::UniValue(__return_storage_ptr__,&info);
    }
    UniValue::~UniValue(&info);
  }
  else {
    if (include_mempool_sequence) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,"Verbose results cannot contain mempool sequence values.",
                 (allocator<char> *)&local_1e0);
      JSONRPCError(__return_storage_ptr___00,-8,(string *)&info);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002a6d15;
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock8,&pool->cs,"pool.cs",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mempool.cpp"
               ,0x159,false);
    local_58 = local_48;
    local_50 = 0;
    local_48[0] = 0;
    str._M_string_length = (size_type)pool;
    str._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    str.field_2._M_allocated_capacity = local_328;
    str.field_2._8_8_ = mempool_sequence;
    UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
    std::__cxx11::string::~string((string *)&local_58);
    CTxMemPool::entryAll
              ((vector<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                *)&local_1e0,pool);
    for (_Var2._M_p = local_1e0._M_dataplus._M_p; _Var2._M_p != (pointer)local_1e0._M_string_length;
        _Var2._M_p = _Var2._M_p + 8) {
      e = *(CTxMemPoolEntry **)_Var2._M_p;
      local_d0 = local_c0;
      local_c8 = 0;
      local_c0[0] = 0;
      str_00._M_string_length = (size_type)pool;
      str_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      str_00.field_2._M_allocated_capacity = local_1e0._M_string_length;
      str_00.field_2._8_8_ = mempool_sequence;
      UniValue::UniValue(&info,VOBJ,str_00);
      std::__cxx11::string::~string((string *)&local_d0);
      entryToJSON(pool,&info,e);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_f0,
                 (base_blob<256u> *)
                 &((e->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->hash);
      UniValue::UniValue(&local_148,&info);
      key._M_string_length = (size_type)pool;
      key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      key.field_2._M_allocated_capacity = local_1e0._M_string_length;
      key.field_2._8_8_ = mempool_sequence;
      val_00.val._M_dataplus._M_p = (pointer)criticalblock8.super_unique_lock._8_8_;
      val_00._0_8_ = criticalblock8.super_unique_lock._M_device;
      val_00._16_40_ = _auStack_308;
      val_00._56_32_ = local_2f0._16_32_;
      UniValue::pushKVEnd(__return_storage_ptr__,key,val_00);
      UniValue::~UniValue(&local_148);
      std::__cxx11::string::~string((string *)&local_f0);
      UniValue::~UniValue(&info);
    }
    std::
    _Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<const_CTxMemPoolEntry>,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                     *)&local_1e0);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002a6d15:
  __stack_chk_fail();
}

Assistant:

UniValue MempoolToJSON(const CTxMemPool& pool, bool verbose, bool include_mempool_sequence)
{
    if (verbose) {
        if (include_mempool_sequence) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Verbose results cannot contain mempool sequence values.");
        }
        LOCK(pool.cs);
        UniValue o(UniValue::VOBJ);
        for (const CTxMemPoolEntry& e : pool.entryAll()) {
            UniValue info(UniValue::VOBJ);
            entryToJSON(pool, info, e);
            // Mempool has unique entries so there is no advantage in using
            // UniValue::pushKV, which checks if the key already exists in O(N).
            // UniValue::pushKVEnd is used instead which currently is O(1).
            o.pushKVEnd(e.GetTx().GetHash().ToString(), std::move(info));
        }
        return o;
    } else {
        UniValue a(UniValue::VARR);
        uint64_t mempool_sequence;
        {
            LOCK(pool.cs);
            for (const CTxMemPoolEntry& e : pool.entryAll()) {
                a.push_back(e.GetTx().GetHash().ToString());
            }
            mempool_sequence = pool.GetSequence();
        }
        if (!include_mempool_sequence) {
            return a;
        } else {
            UniValue o(UniValue::VOBJ);
            o.pushKV("txids", std::move(a));
            o.pushKV("mempool_sequence", mempool_sequence);
            return o;
        }
    }
}